

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O2

char * sanitize_cookie_path(char *cookie_path)

{
  char *__s;
  size_t __n;
  char *new_path;
  
  __s = (*Curl_cstrdup)(cookie_path);
  if (__s == (char *)0x0) {
    new_path = (char *)0x0;
  }
  else {
    new_path = __s;
    __n = strlen(__s);
    if (*__s == '\"') {
      memmove(__s,__s + 1,__n);
      __n = __n - 1;
    }
    if (__n == 0) {
      if (*__s == '/') {
        return __s;
      }
    }
    else {
      if (__s[__n - 1] == '\"') {
        __s[__n - 1] = '\0';
        __n = __n - 1;
      }
      if (*__s == '/') {
        if (__n == 0) {
          return __s;
        }
        if (__s[__n - 1] != '/') {
          return __s;
        }
        __s[__n - 1] = '\0';
        return __s;
      }
    }
    strstore(&new_path,"/",1);
  }
  return new_path;
}

Assistant:

static char *sanitize_cookie_path(const char *cookie_path)
{
  size_t len;
  char *new_path = strdup(cookie_path);
  if(!new_path)
    return NULL;

  /* some stupid site sends path attribute with '"'. */
  len = strlen(new_path);
  if(new_path[0] == '\"') {
    memmove(new_path, new_path + 1, len);
    len--;
  }
  if(len && (new_path[len - 1] == '\"')) {
    new_path[--len] = 0x0;
  }

  /* RFC6265 5.2.4 The Path Attribute */
  if(new_path[0] != '/') {
    /* Let cookie-path be the default-path. */
    strstore(&new_path, "/", 1);
    return new_path;
  }

  /* convert /hoge/ to /hoge */
  if(len && new_path[len - 1] == '/') {
    new_path[len - 1] = 0x0;
  }

  return new_path;
}